

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

void __thiscall duckdb::Serializer::WriteValue<long>(Serializer *this,vector<long,_true> *vec)

{
  bool bVar1;
  reference plVar2;
  vector<long,_std::allocator<long>_> *in_RSI;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> *in_RDI;
  long *item;
  const_iterator __end0;
  const_iterator __begin0;
  vector<long,_true> *__range2;
  size_type count;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> local_28;
  vector<long,_std::allocator<long>_> *local_20;
  size_type local_18;
  vector<long,_std::allocator<long>_> *local_10;
  
  local_10 = in_RSI;
  local_18 = ::std::vector<long,_std::allocator<long>_>::size(in_RSI);
  (*(code *)in_RDI->_M_current[8])(in_RDI,local_18);
  local_20 = local_10;
  local_28._M_current =
       (long *)::std::vector<long,_std::allocator<long>_>::begin(in_stack_ffffffffffffffb8);
  ::std::vector<long,_std::allocator<long>_>::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                               *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    plVar2 = __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator*(&local_28);
    (*(code *)in_RDI->_M_current[0x16])(in_RDI,*plVar2);
    __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
    operator++(&local_28);
  }
  (*(code *)in_RDI->_M_current[9])();
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}